

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O3

int __thiscall HashMap<String,_int>::remove(HashMap<String,_int> *this,char *__filename)

{
  Item *this_00;
  Item *pIVar1;
  Item *pIVar2;
  Iterator *pIVar3;
  
  this_00 = *(Item **)__filename;
  pIVar1 = this_00->nextCell;
  *this_00->cell = pIVar1;
  if (pIVar1 != (Item *)0x0) {
    pIVar1->cell = this_00->cell;
  }
  pIVar1 = this_00->prev;
  pIVar2 = this_00->next;
  pIVar3 = (Iterator *)&pIVar1->next;
  if (pIVar1 == (Item *)0x0) {
    pIVar3 = &this->_begin;
  }
  pIVar3->item = pIVar2;
  pIVar2->prev = pIVar1;
  this->_size = this->_size - 1;
  String::~String(&this_00->key);
  this_00->prev = this->freeItem;
  this->freeItem = this_00;
  return (int)this_00->next;
}

Assistant:

Iterator remove(const Iterator& it)
  {
    Item* item = it.item;

    if((*item->cell = item->nextCell))
      item->nextCell->cell = item->cell;

    if(!item->prev)
      (_begin.item = item->next)->prev = 0;
    else
      (item->prev->next = item->next)->prev = item->prev;

    --_size;

    item->~Item();
    item->prev = freeItem;
    freeItem = item;
    return item->next;
  }